

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_Proto2FileJavaStringCheckUtf8_Test::
FeaturesTest_Proto2FileJavaStringCheckUtf8_Test
          (FeaturesTest_Proto2FileJavaStringCheckUtf8_Test *this)

{
  FeaturesTest_Proto2FileJavaStringCheckUtf8_Test *this_local;
  
  FeaturesTest::FeaturesTest(&this->super_FeaturesTest);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__FeaturesTest_Proto2FileJavaStringCheckUtf8_Test_029ad800;
  return;
}

Assistant:

TEST_F(FeaturesTest, Proto2FileJavaStringCheckUtf8) {
  BuildDescriptorMessagesInTestPool();
  const FileDescriptor* file = BuildFile(
      R"pb(
        name: "foo.proto"
        syntax: "proto2"
        options { java_string_check_utf8: true }
      )pb");
  EXPECT_EQ(file->options().java_string_check_utf8(), true);
}